

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void PrintGraph(InstructionVMGraphContext *ctx,VmModule *module)

{
  OutputContext *pOVar1;
  VmFunction *function;
  
  ctx->code = module->code;
  for (function = (module->functions).head; function != (VmFunction *)0x0; function = function->next
      ) {
    PrintFunction(ctx,function);
  }
  PrintLine(ctx,"// Peephole optimizations: %d",(ulong)module->peepholeOptimizations);
  PrintLine(ctx,"// Constant propagations: %d",(ulong)module->constantPropagations);
  PrintLine(ctx,"// Dead code eliminations: %d",(ulong)module->deadCodeEliminations);
  PrintLine(ctx,"// Control flow simplifications: %d",(ulong)module->controlFlowSimplifications);
  PrintLine(ctx,"// Load store propagation: %d",(ulong)module->loadStorePropagations);
  PrintLine(ctx,"// Common subexpression eliminations: %d",(ulong)module->commonSubexprEliminations)
  ;
  PrintLine(ctx,"// Dead alloca store eliminations: %d",(ulong)module->deadAllocaStoreEliminations);
  PrintLine(ctx,"// Function inlines: %d",(ulong)module->functionInlines);
  pOVar1 = ctx->output;
  if (pOVar1->outputBufPos != 0) {
    (*pOVar1->writeStream)(pOVar1->stream,pOVar1->outputBuf,pOVar1->outputBufPos);
  }
  pOVar1->outputBufPos = 0;
  return;
}

Assistant:

void PrintGraph(InstructionVMGraphContext &ctx, VmModule *module)
{
	ctx.code = module->code;

	for(VmFunction *value = module->functions.head; value; value = value->next)
		PrintFunction(ctx, value);

	PrintLine(ctx, "// Peephole optimizations: %d", module->peepholeOptimizations);
	PrintLine(ctx, "// Constant propagations: %d", module->constantPropagations);
	PrintLine(ctx, "// Dead code eliminations: %d", module->deadCodeEliminations);
	PrintLine(ctx, "// Control flow simplifications: %d", module->controlFlowSimplifications);
	PrintLine(ctx, "// Load store propagation: %d", module->loadStorePropagations);
	PrintLine(ctx, "// Common subexpression eliminations: %d", module->commonSubexprEliminations);
	PrintLine(ctx, "// Dead alloca store eliminations: %d", module->deadAllocaStoreEliminations);
	PrintLine(ctx, "// Function inlines: %d", module->functionInlines);

	ctx.output.Flush();
}